

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

char * base64_encode(char *buffer,uint len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *__s;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar4 = (ulong)((len * 4) / 3 + 4);
  __s = (char *)malloc(uVar4);
  if (__s == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    lVar7 = 0;
    memset(__s,0,uVar4);
    if (len != 0) {
      lVar3 = 4;
      do {
        lVar7 = lVar3;
        bVar1 = *buffer;
        __s[lVar7 + -4] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
        if (len == 1) {
          buffer = (char *)((byte *)buffer + 1);
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)((byte *)buffer)[1];
          buffer = (char *)((byte *)buffer + 2);
        }
        __s[lVar7 + -3] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [uVar5 >> 4 | (bVar1 & 3) << 4];
        iVar2 = (int)lVar7;
        if (len == 1) {
          __s[iVar2 - 2] = '=';
          uVar4 = (ulong)(iVar2 - 4) | 3;
LAB_00105438:
          __s[uVar4] = '=';
          break;
        }
        uVar6 = 0;
        if (len != 2) {
          uVar6 = (uint)(byte)*buffer;
          buffer = (char *)((byte *)buffer + 1);
        }
        __s[lVar7 + -2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(uVar6 >> 6) + (uVar5 & 0xf) * 4];
        if (len == 2) {
          uVar4 = (ulong)(iVar2 - 1);
          goto LAB_00105438;
        }
        __s[lVar7 + -1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar6 & 0x3f];
        len = len - 3;
        lVar3 = lVar7 + 4;
      } while (len != 0);
    }
    __s[(int)lVar7] = '\0';
  }
  return __s;
}

Assistant:

static char *
base64_encode(char *buffer, unsigned int len)
{
    char * buf;
    int buflen = 0;
    int c1, c2, c3;
    int maxlen = len*4/3 + 4;
#ifdef OVERKILL
    maxlen = len*2 + 2;
#endif

    buf = malloc(maxlen * sizeof(char));
    if(buf == NULL) {
	return NULL;
    } else {
	memset(buf, 0, maxlen * sizeof(char));
    }

    while (len) {
	
	c1 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[c1>>2];

	if (--len == 0) c2 = 0;
	else c2 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[((c1 & 0x3)<< 4) | ((c2 & 0xf0) >> 4)];

	if (len == 0) {
	    buf[buflen++] = '=';
	    buf[buflen++] = '=';
	    break;
	}

	if (--len == 0) c3 = 0;
	else c3 = (unsigned char)*buffer++;

	buf[buflen++] = num_to_char[((c2 & 0xf) << 2) | ((c3 & 0xc0) >>6)];
	if (len == 0) {
	    buf[buflen++] = '=';

	    break;
	}

	--len;
	buf[buflen++] = num_to_char[c3 & 0x3f];

    }

    buf[buflen]=0;

    return buf;
}